

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_> *
__thiscall
llvm::DWARFUnit::findRnglistFromIndex
          (Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
           *__return_storage_ptr__,DWARFUnit *this,uint32_t Index)

{
  bool bVar1;
  unsigned_long *puVar2;
  Optional<unsigned_long> OVar3;
  error_code EC;
  error_code EC_00;
  error_code local_70;
  Error local_60 [3];
  error_code local_48;
  Error local_38;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_30;
  Optional<unsigned_long> Offset;
  uint32_t Index_local;
  DWARFUnit *this_local;
  
  Offset.Storage._12_4_ = Index;
  OVar3 = getRnglistOffset(this,Index);
  local_30 = OVar3.Storage.field_0;
  Offset.Storage.field_0.empty = OVar3.Storage.hasVal;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&local_30.empty);
  if (bVar1) {
    puVar2 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_30);
    findRnglistFromOffset(__return_storage_ptr__,this,*puVar2 + this->RangeSectionBase);
  }
  else {
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&this->RngListTable);
    if (bVar1) {
      std::error_code::error_code<llvm::errc,void>(&local_48,invalid_argument);
      EC._M_cat._0_4_ = local_48._M_value;
      EC._0_8_ = &local_38;
      EC._M_cat._4_4_ = 0;
      createStringError<unsigned_int>
                (EC,(char *)local_48._M_cat,(uint *)"invalid range list table index %d");
      Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
      Expected(__return_storage_ptr__,&local_38);
      Error::~Error(&local_38);
    }
    else {
      std::error_code::error_code<llvm::errc,void>(&local_70,invalid_argument);
      EC_00._M_cat._0_4_ = local_70._M_value;
      EC_00._0_8_ = local_60;
      EC_00._M_cat._4_4_ = 0;
      createStringError(EC_00,(char *)local_70._M_cat);
      Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
      Expected(__return_storage_ptr__,local_60);
      Error::~Error(local_60);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<DWARFAddressRangesVector>
DWARFUnit::findRnglistFromIndex(uint32_t Index) {
  if (auto Offset = getRnglistOffset(Index))
    return findRnglistFromOffset(*Offset + RangeSectionBase);

  if (RngListTable)
    return createStringError(errc::invalid_argument,
                             "invalid range list table index %d", Index);

  return createStringError(errc::invalid_argument,
                           "missing or invalid range list table");
}